

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int katherine_configure(katherine_device_t *device,katherine_config_t *config)

{
  int32_t pll_setup;
  int32_t general_setup;
  int res;
  katherine_config_t *config_local;
  katherine_device_t *device_local;
  
  pll_setup = katherine_set_all_pixel_config(device,&config->pixel_config);
  if ((((((pll_setup == 0) &&
         (pll_setup = katherine_set_acq_time(device,config->acq_time), pll_setup == 0)) &&
        (pll_setup = katherine_set_no_frames(device,config->no_frames), pll_setup == 0)) &&
       ((pll_setup = katherine_set_bias(device,config->bias_id,config->bias), pll_setup == 0 &&
        (pll_setup = katherine_acquisition_setup
                               (device,&config->start_trigger,(_Bool)(config->delayed_start & 1),
                                &config->stop_trigger), pll_setup == 0)))) &&
      ((pll_setup = katherine_set_sensor_register
                              (device,'\x04',
                               (uint)((config->gray_disable & 1U) != 0) << 3 |
                               (config->polarity_holes ^ 0xffU) & 1 | 0x58), pll_setup == 0 &&
       ((pll_setup = katherine_set_sensor_register
                               (device,'\x03',
                                (config->freq & FREQ_160) << 4 |
                                (config->phase & (PHASE_16|PHASE_8)) << 6 | 0xe | 0x2800),
        pll_setup == 0 && (pll_setup = katherine_output_block_config_update(device), pll_setup == 0)
        ))))) &&
     ((pll_setup = katherine_update_sensor_registers(device), pll_setup == 0 &&
      ((pll_setup = katherine_timer_set(device), pll_setup == 0 &&
       (pll_setup = katherine_set_dacs(device,&config->dacs), pll_setup == 0)))))) {
    device_local._4_4_ = 0;
  }
  else {
    device_local._4_4_ = pll_setup;
  }
  return device_local._4_4_;
}

Assistant:

int
katherine_configure(katherine_device_t *device, const katherine_config_t *config)
{
    int res;

    res = katherine_set_all_pixel_config(device, &config->pixel_config);
    if (res) goto err;

    res = katherine_set_acq_time(device, config->acq_time);
    if (res) goto err;

    res = katherine_set_no_frames(device, config->no_frames);
    if (res) goto err;

    res = katherine_set_bias(device, config->bias_id, config->bias);
    if (res) goto err;

    res = katherine_acquisition_setup(device, &config->start_trigger, config->delayed_start, &config->stop_trigger);
    if (res) goto err;

    int32_t general_setup = 0x58;
    general_setup |= !config->polarity_holes;
    general_setup |= (config->gray_disable ? 1 : 0) << 3;
    res = katherine_set_sensor_register(device, TPX3_REG_GENERAL_CONFIG, general_setup);
    if (res) goto err;

    int32_t pll_setup = 0xE;
    pll_setup |= (0x7 & config->phase) << 6;
    pll_setup |= (0x3 & config->freq) << 4;
    pll_setup |= 0x14 << 9;
    res = katherine_set_sensor_register(device, TPX3_REG_PLL_CONFIG, pll_setup);
    if (res) goto err;

    res = katherine_output_block_config_update(device);
    if (res) goto err;

    res = katherine_update_sensor_registers(device);
    if (res) goto err;

    res = katherine_timer_set(device);
    if (res) goto err;

    res = katherine_set_dacs(device, &config->dacs);
    if (res) goto err;

    return 0;

err:
    return res;
}